

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  int iVar1;
  connectdata *conn;
  _Bool _Var2;
  uint uVar3;
  undefined8 *puVar4;
  void *pvVar5;
  ulong uVar6;
  Curl_easy *pCVar7;
  curl_llist_element *pcVar8;
  int in_EDX;
  long lVar9;
  Curl_easy *pCVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  curl_socket_t socks [5];
  int local_6c;
  Curl_easy *local_68;
  curl_hash *local_60;
  int local_54;
  Curl_multi *local_50;
  curl_socket_t local_48 [6];
  
  local_48[0] = -1;
  local_48[1] = 0xffffffff;
  local_48[2] = 0xffffffff;
  local_48[3] = 0xffffffff;
  local_48[4] = 0xffffffff;
  local_68 = data;
  uVar3 = multi_getsock(data,local_48,in_EDX);
  local_60 = &multi->sockhash;
  uVar12 = 0;
  local_50 = multi;
  do {
    if ((uVar3 >> ((byte)uVar12 & 0x1f) & 0x10001) == 0) goto LAB_0012904c;
    iVar1 = local_48[uVar12];
    local_6c = iVar1;
    if (iVar1 == -1) {
      puVar4 = (undefined8 *)0x0;
    }
    else {
      puVar4 = (undefined8 *)Curl_hash_pick(local_60,&local_6c,4);
    }
    bVar13 = (uVar3 >> ((uint)uVar12 & 0x1f) & 1) != 0;
    uVar11 = bVar13 + 2;
    if ((0x10000 << ((byte)uVar12 & 0x1f) & uVar3) == 0) {
      uVar11 = (uint)bVar13;
    }
    if (puVar4 == (undefined8 *)0x0) {
      local_6c = iVar1;
      local_54 = iVar1;
      if ((iVar1 == -1) ||
         (puVar4 = (undefined8 *)Curl_hash_pick(local_60,&local_6c,4), puVar4 == (undefined8 *)0x0))
      {
        puVar4 = (undefined8 *)(*Curl_ccalloc)(1,0x18);
        if (puVar4 == (undefined8 *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        *puVar4 = local_68;
        *(int *)((long)puVar4 + 0xc) = iVar1;
        pvVar5 = Curl_hash_add(local_60,&local_54,4,puVar4);
        if (pvVar5 == (void *)0x0) {
          (*Curl_cfree)(puVar4);
          return CURLM_OUT_OF_MEMORY;
        }
      }
LAB_00129010:
      if (local_50->socket_cb != (curl_socket_callback)0x0) {
        (*local_50->socket_cb)(local_68,iVar1,uVar11,local_50->socket_userp,(void *)puVar4[2]);
      }
      *(uint *)(puVar4 + 1) = uVar11;
    }
    else if (*(uint *)(puVar4 + 1) != uVar11) goto LAB_00129010;
    uVar12 = uVar12 + 1;
  } while (uVar12 != 5);
  uVar12 = 5;
LAB_0012904c:
  pCVar10 = local_68;
  if (0 < local_68->numsocks) {
    lVar9 = 0;
    do {
      iVar1 = pCVar10->sockets[lVar9];
      if ((int)uVar12 != 0) {
        uVar6 = 0;
        do {
          if (iVar1 == local_48[uVar6]) goto LAB_00129159;
          uVar6 = uVar6 + 1;
        } while ((uVar12 & 0xffffffff) != uVar6);
      }
      local_6c = iVar1;
      if ((iVar1 != -1) &&
         (puVar4 = (undefined8 *)Curl_hash_pick(local_60,&local_6c,4), pCVar10 = local_68,
         puVar4 != (undefined8 *)0x0)) {
        conn = local_68->easy_conn;
        if (conn == (connectdata *)0x0) {
LAB_001290db:
          if (local_50->socket_cb != (curl_socket_callback)0x0) {
            (*local_50->socket_cb)(local_68,iVar1,4,local_50->socket_userp,(void *)puVar4[2]);
          }
          local_6c = iVar1;
          Curl_hash_delete(local_60,&local_6c,4);
          pCVar10 = local_68;
        }
        else {
          if ((conn->recv_pipe).size < 2) {
            if ((conn->send_pipe).size < 2) goto LAB_001290db;
            pCVar7 = (Curl_easy *)*puVar4;
          }
          else {
            pCVar7 = (Curl_easy *)*puVar4;
            if (pCVar7 == local_68) {
              _Var2 = Curl_recvpipe_head(local_68,conn);
              pcVar8 = (conn->recv_pipe).head;
              if (_Var2) {
                pcVar8 = pcVar8->next;
              }
              pCVar7 = (Curl_easy *)pcVar8->ptr;
              *puVar4 = pCVar7;
            }
            pCVar10 = local_68;
            if ((conn->send_pipe).size < 2) goto LAB_00129159;
          }
          pCVar10 = local_68;
          if (pCVar7 == local_68) {
            _Var2 = Curl_sendpipe_head(local_68,conn);
            pcVar8 = (conn->send_pipe).head;
            if (_Var2) {
              pvVar5 = pcVar8->next->ptr;
            }
            else {
              pvVar5 = pcVar8->ptr;
            }
            *puVar4 = pvVar5;
            pCVar10 = local_68;
          }
        }
      }
LAB_00129159:
      lVar9 = lVar9 + 1;
    } while (lVar9 < pCVar10->numsocks);
  }
  memcpy(pCVar10->sockets,local_48,(uVar12 & 0xffffffff) << 2);
  pCVar10->numsocks = (int)uVar12;
  return CURLM_OK;
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;

  for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks, MAX_SOCKSPEREASYHANDLE);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    int action = CURL_POLL_NONE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    if(entry) {
      /* yeps, already present so check if it has the same action set */
      if(entry->action == action)
        /* same, continue */
        continue;
    }
    else {
      /* this is a socket we didn't have before, add it! */
      entry = sh_addentry(&multi->sockhash, s, data);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }

    /* we know (entry != NULL) at this point, see the logic above */
    if(multi->socket_cb)
      multi->socket_cb(data,
                       s,
                       action,
                       multi->socket_userp,
                       entry->socketp);

    entry->action = action; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i = 0; i< data->numsocks; i++) {
    int j;
    s = data->sockets[i];
    for(j = 0; j<num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        s = CURL_SOCKET_BAD;
        break;
      }
    }

    entry = sh_getentry(&multi->sockhash, s);
    if(entry) {
      /* this socket has been removed. Tell the app to remove it */
      bool remove_sock_from_hash = TRUE;

      /* check if the socket to be removed serves a connection which has
         other easy-s in a pipeline. In this case the socket should not be
         removed. */
      struct connectdata *easy_conn = data->easy_conn;
      if(easy_conn) {
        if(easy_conn->recv_pipe.size > 1) {
          /* the handle should not be removed from the pipe yet */
          remove_sock_from_hash = FALSE;

          /* Update the sockhash entry to instead point to the next in line
             for the recv_pipe, or the first (in case this particular easy
             isn't already) */
          if(entry->easy == data) {
            if(Curl_recvpipe_head(data, easy_conn))
              entry->easy = easy_conn->recv_pipe.head->next->ptr;
            else
              entry->easy = easy_conn->recv_pipe.head->ptr;
          }
        }
        if(easy_conn->send_pipe.size > 1) {
          /* the handle should not be removed from the pipe yet */
          remove_sock_from_hash = FALSE;

          /* Update the sockhash entry to instead point to the next in line
             for the send_pipe, or the first (in case this particular easy
             isn't already) */
          if(entry->easy == data) {
            if(Curl_sendpipe_head(data, easy_conn))
              entry->easy = easy_conn->send_pipe.head->next->ptr;
            else
              entry->easy = easy_conn->send_pipe.head->ptr;
          }
        }
        /* Don't worry about overwriting recv_pipe head with send_pipe_head,
           when action will be asked on the socket (see multi_socket()), the
           head of the correct pipe will be taken according to the
           action. */
      }

      if(remove_sock_from_hash) {
        /* in this case 'entry' is always non-NULL */
        if(multi->socket_cb)
          multi->socket_cb(data,
                           s,
                           CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(&multi->sockhash, s);
      }
    } /* if sockhash entry existed */
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  data->numsocks = num;
  return CURLM_OK;
}